

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O0

bool __thiscall
tinygltf::TinyGLTF::WriteGltfSceneToFile
          (TinyGLTF *this,Model *model,string *filename,bool embedImages,bool embedBuffers,
          bool prettyPrint,bool writeBinary)

{
  pointer *this_00;
  bool bVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  size_type sVar5;
  const_reference pvVar6;
  const_reference pvVar7;
  detail local_318 [32];
  detail local_2f8 [32];
  string local_2d8 [8];
  string uri;
  undefined1 local_2b8 [8];
  json image;
  undefined1 local_2a0 [4];
  uint i_1;
  json images;
  allocator local_269;
  string local_268 [32];
  __cxx11 local_248 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208 [32];
  reference local_1e8;
  string *usedName;
  iterator __end7;
  iterator __begin7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range7;
  int numUsed;
  bool inUse;
  uint local_19c;
  string local_198 [8];
  string binUri;
  string local_178 [8];
  string binFilename;
  string local_158 [8];
  string binSavePath;
  undefined1 local_138 [8];
  json buffer;
  undefined1 local_120 [4];
  uint i;
  json buffers;
  vector<unsigned_char,_std::allocator<unsigned_char>_> binBuffer;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  usedFilenames;
  string baseDir;
  string local_c0 [32];
  long local_a0;
  size_type pos;
  string local_90 [8];
  string defaultBinFileExt;
  tinygltf local_60 [8];
  string defaultBinFilename;
  undefined1 local_40 [8];
  JsonDocument output;
  bool writeBinary_local;
  bool prettyPrint_local;
  bool embedBuffers_local;
  bool embedImages_local;
  string *filename_local;
  Model *model_local;
  TinyGLTF *this_local;
  
  output.m_value.number_integer._4_1_ = writeBinary;
  output.m_value.number_integer._5_1_ = prettyPrint;
  output.m_value.number_integer._6_1_ = embedBuffers;
  output.m_value.number_integer._7_1_ = embedImages;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)local_40,(nullptr_t)0x0);
  GetBaseFilename(local_60,filename);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,".bin",(allocator *)((long)&pos + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&pos + 7));
  std::__cxx11::string::length();
  local_a0 = std::__cxx11::string::rfind((char)local_60,0x2e);
  if (local_a0 != -1) {
    std::__cxx11::string::substr((ulong)local_c0,(ulong)local_60);
    std::__cxx11::string::operator=((string *)local_60,local_c0);
    std::__cxx11::string::~string(local_c0);
  }
  GetBaseDir((tinygltf *)
             &usedFilenames.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,filename);
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) != 0) {
    std::__cxx11::string::operator=
              ((string *)
               &usedFilenames.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,"./");
  }
  SerializeGltfModel(model,(json *)local_40);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&binBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&buffers.m_value);
  sVar5 = std::vector<tinygltf::Buffer,_std::allocator<tinygltf::Buffer>_>::size(&model->buffers);
  if (sVar5 != 0) {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  *)local_120,(nullptr_t)0x0);
    sVar5 = std::vector<tinygltf::Buffer,_std::allocator<tinygltf::Buffer>_>::size(&model->buffers);
    detail::JsonReserveArray((json *)local_120,sVar5);
    for (buffer.m_value.number_integer._4_4_ = 0;
        uVar4 = (ulong)(uint)buffer.m_value.number_unsigned._4_4_,
        sVar5 = std::vector<tinygltf::Buffer,_std::allocator<tinygltf::Buffer>_>::size
                          (&model->buffers), uVar4 < sVar5;
        buffer.m_value.number_integer._4_4_ = buffer.m_value.number_integer._4_4_ + 1) {
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)local_138,(nullptr_t)0x0);
      if (((output.m_value.number_unsigned._4_1_ & 1) == 0) ||
         (buffer.m_value.number_integer._4_4_ != 0)) {
LAB_0011a1a6:
        if ((output.m_value.number_unsigned._6_1_ & 1) != 0) {
          pvVar6 = std::vector<tinygltf::Buffer,_std::allocator<tinygltf::Buffer>_>::operator[]
                             (&model->buffers,(ulong)(uint)buffer.m_value.number_unsigned._4_4_);
          SerializeGltfBuffer(pvVar6,(json *)local_138);
          goto LAB_0011a6ff;
        }
        std::__cxx11::string::string(local_158);
        std::__cxx11::string::string(local_178);
        std::__cxx11::string::string(local_198);
        std::vector<tinygltf::Buffer,_std::allocator<tinygltf::Buffer>_>::operator[]
                  (&model->buffers,(ulong)(uint)buffer.m_value.number_unsigned._4_4_);
        uVar4 = std::__cxx11::string::empty();
        if ((uVar4 & 1) == 0) {
          pvVar6 = std::vector<tinygltf::Buffer,_std::allocator<tinygltf::Buffer>_>::operator[]
                             (&model->buffers,(ulong)(uint)buffer.m_value.number_unsigned._4_4_);
          bVar2 = IsDataURI(&pvVar6->uri);
          if (bVar2) goto LAB_0011a2ef;
          pvVar6 = std::vector<tinygltf::Buffer,_std::allocator<tinygltf::Buffer>_>::operator[]
                             (&model->buffers,(ulong)(uint)buffer.m_value.number_unsigned._4_4_);
          std::__cxx11::string::operator=(local_198,(string *)&pvVar6->uri);
          bVar2 = std::
                  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_void_*)>
                  ::operator()(&(this->uri_cb).decode,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_198,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_178,(this->uri_cb).user_data);
          if (bVar2) goto LAB_0011a5e7;
          this_local._7_1_ = 0;
          local_19c = 1;
        }
        else {
LAB_0011a2ef:
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &numUsed,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_60);
          std::__cxx11::string::operator=(local_178,(string *)&numUsed);
          std::__cxx11::string::~string((string *)&numUsed);
          bVar2 = true;
          __range7._0_4_ = 0;
LAB_0011a338:
          if (bVar2) {
            bVar2 = false;
            this_00 = &binBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
            __end7 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)this_00);
            usedName = (string *)
                       std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)this_00);
            while (bVar1 = __gnu_cxx::operator!=
                                     (&__end7,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                               *)&usedName), bVar1) {
              local_1e8 = __gnu_cxx::
                          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::operator*(&__end7);
              iVar3 = std::__cxx11::string::compare(local_178);
              if (iVar3 == 0) {
                bVar2 = true;
                std::__cxx11::to_string(local_248,(int)__range7);
                std::operator+(local_228,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_60);
                std::operator+(local_208,local_228);
                std::__cxx11::string::operator=(local_178,(string *)local_208);
                std::__cxx11::string::~string((string *)local_208);
                std::__cxx11::string::~string((string *)local_228);
                std::__cxx11::string::~string((string *)local_248);
                __range7._0_4_ = (int)__range7 + 1;
                break;
              }
              __gnu_cxx::
              __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator++(&__end7);
            }
            goto LAB_0011a338;
          }
          bVar2 = std::function::operator_cast_to_bool((function *)&this->uri_cb);
          if (bVar2) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_268,"buffer",&local_269);
            bVar2 = std::
                    function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_void_*)>
                    ::operator()(&(this->uri_cb).encode,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_178,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_268,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_198,(this->uri_cb).user_data);
            std::__cxx11::string::~string(local_268);
            std::allocator<char>::~allocator((allocator<char> *)&local_269);
            if (((bVar2 ^ 0xffU) & 1) != 0) {
              this_local._7_1_ = 0;
              local_19c = 1;
              goto LAB_0011a6a5;
            }
          }
          else {
            std::__cxx11::string::operator=(local_198,local_178);
          }
LAB_0011a5e7:
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&binBuffer.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,(value_type *)local_178);
          JoinPath((tinygltf *)&images.m_value.boolean,
                   (string *)
                   &usedFilenames.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)local_178);
          std::__cxx11::string::operator=(local_158,(string *)&images.m_value.boolean);
          std::__cxx11::string::~string((string *)&images.m_value.boolean);
          pvVar6 = std::vector<tinygltf::Buffer,_std::allocator<tinygltf::Buffer>_>::operator[]
                             (&model->buffers,(ulong)(uint)buffer.m_value.number_unsigned._4_4_);
          bVar2 = SerializeGltfBuffer(pvVar6,(json *)local_138,(string *)local_158,
                                      (string *)local_198);
          if (bVar2) {
            local_19c = 0;
          }
          else {
            this_local._7_1_ = 0;
            local_19c = 1;
          }
        }
LAB_0011a6a5:
        std::__cxx11::string::~string(local_198);
        std::__cxx11::string::~string(local_178);
        std::__cxx11::string::~string(local_158);
        if (local_19c == 0) goto LAB_0011a6ff;
      }
      else {
        std::vector<tinygltf::Buffer,_std::allocator<tinygltf::Buffer>_>::operator[]
                  (&model->buffers,0);
        uVar4 = std::__cxx11::string::empty();
        if ((uVar4 & 1) == 0) goto LAB_0011a1a6;
        pvVar6 = std::vector<tinygltf::Buffer,_std::allocator<tinygltf::Buffer>_>::operator[]
                           (&model->buffers,(ulong)(uint)buffer.m_value.number_unsigned._4_4_);
        SerializeGltfBufferBin
                  (pvVar6,(json *)local_138,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&buffers.m_value);
LAB_0011a6ff:
        detail::JsonPushBack((json *)local_120,(json *)local_138);
        local_19c = 0;
      }
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     *)local_138);
      if (local_19c != 0) goto LAB_0011a77d;
    }
    detail::JsonAddMember((json *)local_40,"buffers",(json *)local_120);
    local_19c = 0;
LAB_0011a77d:
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)local_120);
    if (local_19c != 0) goto LAB_0011ab27;
  }
  sVar5 = std::vector<tinygltf::Image,_std::allocator<tinygltf::Image>_>::size(&model->images);
  if (sVar5 != 0) {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  *)local_2a0,(nullptr_t)0x0);
    sVar5 = std::vector<tinygltf::Image,_std::allocator<tinygltf::Image>_>::size(&model->images);
    detail::JsonReserveArray((json *)local_2a0,sVar5);
    for (image.m_value.number_integer._4_4_ = 0;
        uVar4 = (ulong)(uint)image.m_value.number_unsigned._4_4_,
        sVar5 = std::vector<tinygltf::Image,_std::allocator<tinygltf::Image>_>::size(&model->images)
        , uVar4 < sVar5; image.m_value.number_integer._4_4_ = image.m_value.number_integer._4_4_ + 1
        ) {
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)local_2b8,(nullptr_t)0x0);
      std::__cxx11::string::string(local_2d8);
      pvVar7 = std::vector<tinygltf::Image,_std::allocator<tinygltf::Image>_>::operator[]
                         (&model->images,(ulong)(uint)image.m_value.number_unsigned._4_4_);
      bVar2 = UpdateImageObject(pvVar7,(string *)
                                       &usedFilenames.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                image.m_value.number_integer._4_4_,
                                (bool)(output.m_value.number_unsigned._7_1_ & 1),&this->fs,
                                &this->uri_cb,&this->WriteImageData,this->write_image_user_data_,
                                (string *)local_2d8);
      if (bVar2) {
        pvVar7 = std::vector<tinygltf::Image,_std::allocator<tinygltf::Image>_>::operator[]
                           (&model->images,(ulong)(uint)image.m_value.number_unsigned._4_4_);
        SerializeGltfImage(pvVar7,(string *)local_2d8,(json *)local_2b8);
        detail::JsonPushBack((json *)local_2a0,(json *)local_2b8);
      }
      else {
        this_local._7_1_ = 0;
      }
      local_19c = (uint)!bVar2;
      std::__cxx11::string::~string(local_2d8);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     *)local_2b8);
      if (local_19c != 0) goto LAB_0011a9c9;
    }
    detail::JsonAddMember((json *)local_40,"images",(json *)local_2a0);
    local_19c = 0;
LAB_0011a9c9:
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)local_2a0);
    if (local_19c != 0) goto LAB_0011ab27;
  }
  if ((output.m_value.number_unsigned._4_1_ & 1) == 0) {
    detail::JsonToString
              (local_318,(json *)local_40,((byte)output.m_value.number_unsigned._5_1_ & 1) - 1 | 2);
    this_local._7_1_ = WriteGltfFile(filename,(string *)local_318);
    std::__cxx11::string::~string((string *)local_318);
    local_19c = 1;
  }
  else {
    detail::JsonToString(local_2f8,(json *)local_40,-1);
    this_local._7_1_ =
         WriteBinaryGltfFile(filename,(string *)local_2f8,
                             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                             &buffers.m_value);
    std::__cxx11::string::~string((string *)local_2f8);
    local_19c = 1;
  }
LAB_0011ab27:
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&buffers.m_value);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&binBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string
            ((string *)
             &usedFilenames.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string((string *)local_60);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 *)local_40);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool TinyGLTF::WriteGltfSceneToFile(const Model *model,
                                    const std::string &filename,
                                    bool embedImages = false,
                                    bool embedBuffers = false,
                                    bool prettyPrint = true,
                                    bool writeBinary = false) {
  detail::JsonDocument output;
  std::string defaultBinFilename = GetBaseFilename(filename);
  std::string defaultBinFileExt = ".bin";
  std::string::size_type pos =
      defaultBinFilename.rfind('.', defaultBinFilename.length());

  if (pos != std::string::npos) {
    defaultBinFilename = defaultBinFilename.substr(0, pos);
  }
  std::string baseDir = GetBaseDir(filename);
  if (baseDir.empty()) {
    baseDir = "./";
  }
  /// Serialize all properties except buffers and images.
  SerializeGltfModel(model, output);

  // BUFFERS
  std::vector<std::string> usedFilenames;
  std::vector<unsigned char> binBuffer;
  if (model->buffers.size()) {
    detail::json buffers;
    detail::JsonReserveArray(buffers, model->buffers.size());
    for (unsigned int i = 0; i < model->buffers.size(); ++i) {
      detail::json buffer;
      if (writeBinary && i == 0 && model->buffers[i].uri.empty()) {
        SerializeGltfBufferBin(model->buffers[i], buffer, binBuffer);
      } else if (embedBuffers) {
        SerializeGltfBuffer(model->buffers[i], buffer);
      } else {
        std::string binSavePath;
        std::string binFilename;
        std::string binUri;
        if (!model->buffers[i].uri.empty() &&
            !IsDataURI(model->buffers[i].uri)) {
          binUri = model->buffers[i].uri;
          if (!uri_cb.decode(binUri, &binFilename, uri_cb.user_data)) {
            return false;
          }
        } else {
          binFilename = defaultBinFilename + defaultBinFileExt;
          bool inUse = true;
          int numUsed = 0;
          while (inUse) {
            inUse = false;
            for (const std::string &usedName : usedFilenames) {
              if (binFilename.compare(usedName) != 0) continue;
              inUse = true;
              binFilename = defaultBinFilename + std::to_string(numUsed++) +
                            defaultBinFileExt;
              break;
            }
          }

          if (uri_cb.encode) {
            if (!uri_cb.encode(binFilename, "buffer", &binUri,
                               uri_cb.user_data)) {
              return false;
            }
          } else {
            binUri = binFilename;
          }
        }
        usedFilenames.push_back(binFilename);
        binSavePath = JoinPath(baseDir, binFilename);
        if (!SerializeGltfBuffer(model->buffers[i], buffer, binSavePath,
                                 binUri)) {
          return false;
        }
      }
      detail::JsonPushBack(buffers, std::move(buffer));
    }
    detail::JsonAddMember(output, "buffers", std::move(buffers));
  }

  // IMAGES
  if (model->images.size()) {
    detail::json images;
    detail::JsonReserveArray(images, model->images.size());
    for (unsigned int i = 0; i < model->images.size(); ++i) {
      detail::json image;

      std::string uri;
      if (!UpdateImageObject(model->images[i], baseDir, int(i), embedImages,
                             &fs, &uri_cb, this->WriteImageData,
                             this->write_image_user_data_, &uri)) {
        return false;
      }
      SerializeGltfImage(model->images[i], uri, image);
      detail::JsonPushBack(images, std::move(image));
    }
    detail::JsonAddMember(output, "images", std::move(images));
  }

  if (writeBinary) {
    return WriteBinaryGltfFile(filename, detail::JsonToString(output),
                               binBuffer);
  } else {
    return WriteGltfFile(filename,
                         detail::JsonToString(output, (prettyPrint ? 2 : -1)));
  }
}